

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_constants.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_2::ValidateConstantComposite(ValidationState_t *_,Instruction *inst)

{
  bool bVar1;
  Op OVar2;
  uint32_t uVar3;
  int32_t iVar4;
  Op OVar5;
  uint uVar6;
  uint32_t uVar7;
  char *__rhs;
  DiagnosticStream *pDVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar9;
  size_type sVar10;
  const_reference pvVar11;
  ulong uVar12;
  vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_> *pvVar13;
  string local_36b8;
  string local_3698;
  DiagnosticStream local_3678;
  Instruction *local_34a0;
  Instruction *component_type_2;
  undefined1 local_3490 [4];
  uint component_type_id;
  Instruction *local_32b8;
  Instruction *constituent_type_2;
  DiagnosticStream local_3290;
  Instruction *local_30b8;
  Instruction *constituent_4;
  undefined1 local_30a8 [4];
  uint constituent_id_4;
  DiagnosticStream local_3088;
  string local_2eb0;
  string local_2e90;
  DiagnosticStream local_2e70;
  Instruction *local_2c98;
  Instruction *member_type;
  undefined1 local_2c88 [4];
  uint member_type_id;
  Instruction *local_2ab0;
  Instruction *constituent_type_1;
  DiagnosticStream local_2a88;
  Instruction *local_28b0;
  Instruction *constituent_3;
  uint local_28a0;
  uint constituent_id_3;
  uint32_t member_index;
  uint32_t constituent_index_3;
  string local_2878;
  DiagnosticStream local_2858;
  ulong local_2680;
  size_type member_count;
  string local_2658;
  DiagnosticStream local_2638;
  DiagnosticStream local_2460;
  Instruction *local_2288;
  Instruction *constituent_type;
  DiagnosticStream local_2260;
  Instruction *local_2088;
  Instruction *constituent_2;
  ulong uStack_2078;
  uint constituent_id_2;
  size_t constituent_index_2;
  DiagnosticStream local_2050;
  tuple<bool_&,_bool_&,_unsigned_int_&> local_1e78;
  tuple<bool,_bool,_unsigned_int> local_1e60;
  uint local_1e58;
  bool local_1e52;
  bool local_1e51;
  uint32_t value;
  bool is_const;
  bool is_int32;
  Instruction *local_1c78;
  Instruction *length;
  Instruction *local_1a98;
  Instruction *element_type;
  string local_1a70;
  DiagnosticStream local_1a50;
  string local_1878;
  string local_1858;
  DiagnosticStream local_1838;
  Instruction *local_1660;
  Instruction *vector_component_type;
  string local_1638;
  DiagnosticStream local_1618;
  DiagnosticStream local_1440;
  Instruction *local_1268;
  Instruction *vector;
  DiagnosticStream local_1240;
  Instruction *local_1068;
  Instruction *constituent_1;
  ulong uStack_1058;
  uint constituent_id_1;
  size_t constituent_index_1;
  Instruction *local_e78;
  Instruction *component_type_1;
  undefined1 local_e68 [4];
  uint component_count_1;
  Instruction *local_c90;
  Instruction *column_type;
  DiagnosticStream local_c68;
  uint local_a8c;
  undefined1 local_a88 [4];
  uint column_count;
  string local_a68;
  DiagnosticStream local_a48;
  Instruction *local_870;
  Instruction *constituent_result_type;
  DiagnosticStream local_848;
  Instruction *local_670;
  Instruction *constituent;
  ulong uStack_660;
  uint constituent_id;
  size_t constituent_index;
  Instruction *local_480;
  Instruction *component_type;
  DiagnosticStream local_458;
  uint local_27c;
  ulong uStack_278;
  uint component_count;
  size_type constituent_count;
  string local_268;
  DiagnosticStream local_248;
  Instruction *local_70;
  Instruction *result_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string opcode_name;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  opcode_name.field_2._8_8_ = inst;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"Op",(allocator<char> *)((long)&result_type + 7));
  OVar2 = Instruction::opcode((Instruction *)opcode_name.field_2._8_8_);
  __rhs = spvOpcodeString(OVar2);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 &local_60,__rhs);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)((long)&result_type + 7));
  uVar3 = Instruction::type_id((Instruction *)opcode_name.field_2._8_8_);
  local_70 = ValidationState_t::FindDef(_,uVar3);
  if (local_70 != (Instruction *)0x0) {
    OVar2 = Instruction::opcode(local_70);
    iVar4 = spvOpcodeIsComposite(OVar2);
    if (iVar4 != 0) {
      pvVar9 = Instruction::words((Instruction *)opcode_name.field_2._8_8_);
      sVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar9);
      uStack_278 = sVar10 - 3;
      OVar2 = Instruction::opcode(local_70);
      if (OVar2 == OpTypeVector) {
        local_27c = Instruction::GetOperandAs<unsigned_int>(local_70,2);
        if (local_27c != uStack_278) {
          ValidationState_t::diag
                    (&local_458,_,SPV_ERROR_INVALID_ID,(Instruction *)opcode_name.field_2._8_8_);
          pDVar8 = DiagnosticStream::operator<<
                             (&local_458,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40);
          pDVar8 = DiagnosticStream::operator<<
                             (pDVar8,(char (*) [57])
                                     " Constituent <id> count does not match Result Type <id> ");
          uVar3 = Instruction::id(local_70);
          ValidationState_t::getIdName_abi_cxx11_((string *)&component_type,_,uVar3);
          pDVar8 = DiagnosticStream::operator<<
                             (pDVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&component_type);
          pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [26])"s vector component count.");
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
          std::__cxx11::string::~string((string *)&component_type);
          DiagnosticStream::~DiagnosticStream(&local_458);
          goto LAB_0053119e;
        }
        uVar6 = Instruction::GetOperandAs<unsigned_int>(local_70,1);
        local_480 = ValidationState_t::FindDef(_,uVar6);
        if (local_480 == (Instruction *)0x0) {
          ValidationState_t::diag
                    ((DiagnosticStream *)&constituent_index,_,SPV_ERROR_INVALID_ID,local_70);
          pDVar8 = DiagnosticStream::operator<<
                             ((DiagnosticStream *)&constituent_index,
                              (char (*) [31])"Component type is not defined.");
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&constituent_index);
          goto LAB_0053119e;
        }
        uStack_660 = 2;
        while( true ) {
          uVar12 = uStack_660;
          pvVar13 = Instruction::operands((Instruction *)opcode_name.field_2._8_8_);
          sVar10 = std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::size
                             (pvVar13);
          if (sVar10 <= uVar12) break;
          constituent._4_4_ =
               Instruction::GetOperandAs<unsigned_int>
                         ((Instruction *)opcode_name.field_2._8_8_,uStack_660);
          local_670 = ValidationState_t::FindDef(_,constituent._4_4_);
          if (local_670 == (Instruction *)0x0) {
LAB_0052f9af:
            ValidationState_t::diag
                      (&local_848,_,SPV_ERROR_INVALID_ID,(Instruction *)opcode_name.field_2._8_8_);
            pDVar8 = DiagnosticStream::operator<<
                               (&local_848,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_40);
            pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [19])" Constituent <id> ");
            ValidationState_t::getIdName_abi_cxx11_
                      ((string *)&constituent_result_type,_,constituent._4_4_);
            pDVar8 = DiagnosticStream::operator<<
                               (pDVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&constituent_result_type);
            pDVar8 = DiagnosticStream::operator<<
                               (pDVar8,(char (*) [29])" is not a constant or undef.");
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
            std::__cxx11::string::~string((string *)&constituent_result_type);
            DiagnosticStream::~DiagnosticStream(&local_848);
            goto LAB_0053119e;
          }
          OVar2 = Instruction::opcode(local_670);
          bVar1 = spvOpcodeIsConstantOrUndef(OVar2);
          if (!bVar1) goto LAB_0052f9af;
          uVar3 = Instruction::type_id(local_670);
          local_870 = ValidationState_t::FindDef(_,uVar3);
          if (local_870 == (Instruction *)0x0) {
LAB_0052fabc:
            ValidationState_t::diag
                      (&local_a48,_,SPV_ERROR_INVALID_ID,(Instruction *)opcode_name.field_2._8_8_);
            pDVar8 = DiagnosticStream::operator<<
                               (&local_a48,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_40);
            pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [19])" Constituent <id> ");
            ValidationState_t::getIdName_abi_cxx11_(&local_a68,_,constituent._4_4_);
            pDVar8 = DiagnosticStream::operator<<(pDVar8,&local_a68);
            pDVar8 = DiagnosticStream::operator<<
                               (pDVar8,(char (*) [40])"s type does not match Result Type <id> ");
            uVar3 = Instruction::id(local_70);
            ValidationState_t::getIdName_abi_cxx11_((string *)local_a88,_,uVar3);
            pDVar8 = DiagnosticStream::operator<<
                               (pDVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_a88);
            pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [23])"s vector element type.");
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
            std::__cxx11::string::~string((string *)local_a88);
            std::__cxx11::string::~string((string *)&local_a68);
            DiagnosticStream::~DiagnosticStream(&local_a48);
            goto LAB_0053119e;
          }
          uVar3 = Instruction::id(local_480);
          uVar7 = Instruction::id(local_870);
          if (uVar3 != uVar7) goto LAB_0052fabc;
          uStack_660 = uStack_660 + 1;
        }
      }
      else if (OVar2 == OpTypeMatrix) {
        local_a8c = Instruction::GetOperandAs<unsigned_int>(local_70,2);
        if (local_a8c != uStack_278) {
          ValidationState_t::diag
                    (&local_c68,_,SPV_ERROR_INVALID_ID,(Instruction *)opcode_name.field_2._8_8_);
          pDVar8 = DiagnosticStream::operator<<
                             (&local_c68,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40);
          pDVar8 = DiagnosticStream::operator<<
                             (pDVar8,(char (*) [57])
                                     " Constituent <id> count does not match Result Type <id> ");
          uVar3 = Instruction::id(local_70);
          ValidationState_t::getIdName_abi_cxx11_((string *)&column_type,_,uVar3);
          pDVar8 = DiagnosticStream::operator<<
                             (pDVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&column_type);
          pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [23])"s matrix column count.");
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
          std::__cxx11::string::~string((string *)&column_type);
          DiagnosticStream::~DiagnosticStream(&local_c68);
          goto LAB_0053119e;
        }
        pvVar9 = Instruction::words(local_70);
        pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar9,2);
        local_c90 = ValidationState_t::FindDef(_,*pvVar11);
        if (local_c90 == (Instruction *)0x0) {
          ValidationState_t::diag((DiagnosticStream *)local_e68,_,SPV_ERROR_INVALID_ID,local_70);
          pDVar8 = DiagnosticStream::operator<<
                             ((DiagnosticStream *)local_e68,
                              (char (*) [28])"Column type is not defined.");
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_e68);
          goto LAB_0053119e;
        }
        component_type_1._4_4_ = Instruction::GetOperandAs<unsigned_int>(local_c90,2);
        uVar6 = Instruction::GetOperandAs<unsigned_int>(local_c90,1);
        local_e78 = ValidationState_t::FindDef(_,uVar6);
        if (local_e78 == (Instruction *)0x0) {
          ValidationState_t::diag
                    ((DiagnosticStream *)&constituent_index_1,_,SPV_ERROR_INVALID_ID,local_c90);
          pDVar8 = DiagnosticStream::operator<<
                             ((DiagnosticStream *)&constituent_index_1,
                              (char (*) [31])"Component type is not defined.");
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&constituent_index_1);
          goto LAB_0053119e;
        }
        uStack_1058 = 2;
        while( true ) {
          uVar12 = uStack_1058;
          pvVar13 = Instruction::operands((Instruction *)opcode_name.field_2._8_8_);
          sVar10 = std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::size
                             (pvVar13);
          if (sVar10 <= uVar12) break;
          constituent_1._4_4_ =
               Instruction::GetOperandAs<unsigned_int>
                         ((Instruction *)opcode_name.field_2._8_8_,uStack_1058);
          local_1068 = ValidationState_t::FindDef(_,constituent_1._4_4_);
          if (local_1068 == (Instruction *)0x0) {
LAB_0052fe8b:
            ValidationState_t::diag
                      (&local_1240,_,SPV_ERROR_INVALID_ID,(Instruction *)opcode_name.field_2._8_8_);
            pDVar8 = DiagnosticStream::operator<<
                               (&local_1240,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_40);
            pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [19])" Constituent <id> ");
            ValidationState_t::getIdName_abi_cxx11_((string *)&vector,_,constituent_1._4_4_);
            pDVar8 = DiagnosticStream::operator<<
                               (pDVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&vector);
            pDVar8 = DiagnosticStream::operator<<
                               (pDVar8,(char (*) [29])" is not a constant or undef.");
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
            std::__cxx11::string::~string((string *)&vector);
            DiagnosticStream::~DiagnosticStream(&local_1240);
            goto LAB_0053119e;
          }
          OVar2 = Instruction::opcode(local_1068);
          bVar1 = spvOpcodeIsConstantOrUndef(OVar2);
          if (!bVar1) goto LAB_0052fe8b;
          uVar3 = Instruction::type_id(local_1068);
          local_1268 = ValidationState_t::FindDef(_,uVar3);
          if (local_1268 == (Instruction *)0x0) {
            ValidationState_t::diag(&local_1440,_,SPV_ERROR_INVALID_ID,local_1068);
            pDVar8 = DiagnosticStream::operator<<
                               (&local_1440,(char (*) [28])"Result type is not defined.");
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
            DiagnosticStream::~DiagnosticStream(&local_1440);
            goto LAB_0053119e;
          }
          OVar2 = Instruction::opcode(local_c90);
          OVar5 = Instruction::opcode(local_1268);
          if (OVar2 != OVar5) {
            ValidationState_t::diag
                      (&local_1618,_,SPV_ERROR_INVALID_ID,(Instruction *)opcode_name.field_2._8_8_);
            pDVar8 = DiagnosticStream::operator<<
                               (&local_1618,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_40);
            pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [19])" Constituent <id> ");
            ValidationState_t::getIdName_abi_cxx11_(&local_1638,_,constituent_1._4_4_);
            pDVar8 = DiagnosticStream::operator<<(pDVar8,&local_1638);
            pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [39])0x624823);
            uVar3 = Instruction::id(local_70);
            ValidationState_t::getIdName_abi_cxx11_((string *)&vector_component_type,_,uVar3);
            pDVar8 = DiagnosticStream::operator<<
                               (pDVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&vector_component_type);
            pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [22])"s matrix column type.");
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
            std::__cxx11::string::~string((string *)&vector_component_type);
            std::__cxx11::string::~string((string *)&local_1638);
            DiagnosticStream::~DiagnosticStream(&local_1618);
            goto LAB_0053119e;
          }
          uVar6 = Instruction::GetOperandAs<unsigned_int>(local_1268,1);
          local_1660 = ValidationState_t::FindDef(_,uVar6);
          uVar3 = Instruction::id(local_e78);
          uVar7 = Instruction::id(local_1660);
          uVar6 = component_type_1._4_4_;
          if (uVar3 != uVar7) {
            ValidationState_t::diag
                      (&local_1838,_,SPV_ERROR_INVALID_ID,(Instruction *)opcode_name.field_2._8_8_);
            pDVar8 = DiagnosticStream::operator<<
                               (&local_1838,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_40);
            pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [19])" Constituent <id> ");
            ValidationState_t::getIdName_abi_cxx11_(&local_1858,_,constituent_1._4_4_);
            pDVar8 = DiagnosticStream::operator<<(pDVar8,&local_1858);
            pDVar8 = DiagnosticStream::operator<<
                               (pDVar8,(char (*) [49])
                                       " component type does not match Result Type <id> ");
            uVar3 = Instruction::id(local_70);
            ValidationState_t::getIdName_abi_cxx11_(&local_1878,_,uVar3);
            pDVar8 = DiagnosticStream::operator<<(pDVar8,&local_1878);
            pDVar8 = DiagnosticStream::operator<<
                               (pDVar8,(char (*) [32])"s matrix column component type.");
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
            std::__cxx11::string::~string((string *)&local_1878);
            std::__cxx11::string::~string((string *)&local_1858);
            DiagnosticStream::~DiagnosticStream(&local_1838);
            goto LAB_0053119e;
          }
          pvVar9 = Instruction::words(local_1268);
          pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar9,3);
          if (uVar6 != *pvVar11) {
            ValidationState_t::diag
                      (&local_1a50,_,SPV_ERROR_INVALID_ID,(Instruction *)opcode_name.field_2._8_8_);
            pDVar8 = DiagnosticStream::operator<<
                               (&local_1a50,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_40);
            pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [19])" Constituent <id> ");
            ValidationState_t::getIdName_abi_cxx11_(&local_1a70,_,constituent_1._4_4_);
            pDVar8 = DiagnosticStream::operator<<(pDVar8,&local_1a70);
            pDVar8 = DiagnosticStream::operator<<
                               (pDVar8,(char (*) [57])
                                       " vector component count does not match Result Type <id> ");
            uVar3 = Instruction::id(local_70);
            ValidationState_t::getIdName_abi_cxx11_((string *)&element_type,_,uVar3);
            pDVar8 = DiagnosticStream::operator<<
                               (pDVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&element_type);
            pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [26])"s vector component count.")
            ;
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
            std::__cxx11::string::~string((string *)&element_type);
            std::__cxx11::string::~string((string *)&local_1a70);
            DiagnosticStream::~DiagnosticStream(&local_1a50);
            goto LAB_0053119e;
          }
          uStack_1058 = uStack_1058 + 1;
        }
      }
      else if (OVar2 == OpTypeArray) {
        uVar6 = Instruction::GetOperandAs<unsigned_int>(local_70,1);
        local_1a98 = ValidationState_t::FindDef(_,uVar6);
        if (local_1a98 == (Instruction *)0x0) {
          ValidationState_t::diag((DiagnosticStream *)&length,_,SPV_ERROR_INVALID_ID,local_70);
          pDVar8 = DiagnosticStream::operator<<
                             ((DiagnosticStream *)&length,
                              (char (*) [29])"Element type is not defined.");
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&length);
          goto LAB_0053119e;
        }
        uVar6 = Instruction::GetOperandAs<unsigned_int>(local_70,2);
        local_1c78 = ValidationState_t::FindDef(_,uVar6);
        if (local_1c78 == (Instruction *)0x0) {
          ValidationState_t::diag((DiagnosticStream *)&value,_,SPV_ERROR_INVALID_ID,local_70);
          pDVar8 = DiagnosticStream::operator<<
                             ((DiagnosticStream *)&value,(char (*) [23])"Length is not defined.");
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&value);
          goto LAB_0053119e;
        }
        uVar3 = Instruction::id(local_1c78);
        ValidationState_t::EvalInt32IfConst(&local_1e60,_,uVar3);
        std::tie<bool,bool,unsigned_int>(&local_1e78,&local_1e51,&local_1e52,&local_1e58);
        std::tuple<bool&,bool&,unsigned_int&>::operator=
                  ((tuple<bool&,bool&,unsigned_int&> *)&local_1e78,&local_1e60);
        if ((((local_1e51 & 1U) != 0) && ((local_1e52 & 1U) != 0)) && (local_1e58 != uStack_278)) {
          ValidationState_t::diag
                    (&local_2050,_,SPV_ERROR_INVALID_ID,(Instruction *)opcode_name.field_2._8_8_);
          pDVar8 = DiagnosticStream::operator<<
                             (&local_2050,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40);
          pDVar8 = DiagnosticStream::operator<<
                             (pDVar8,(char (*) [52])
                                     " Constituent count does not match Result Type <id> ");
          uVar3 = Instruction::id(local_70);
          ValidationState_t::getIdName_abi_cxx11_((string *)&constituent_index_2,_,uVar3);
          pDVar8 = DiagnosticStream::operator<<
                             (pDVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&constituent_index_2);
          pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [16])"s array length.");
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
          std::__cxx11::string::~string((string *)&constituent_index_2);
          DiagnosticStream::~DiagnosticStream(&local_2050);
          goto LAB_0053119e;
        }
        uStack_2078 = 2;
        while( true ) {
          uVar12 = uStack_2078;
          pvVar13 = Instruction::operands((Instruction *)opcode_name.field_2._8_8_);
          sVar10 = std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::size
                             (pvVar13);
          if (sVar10 <= uVar12) break;
          constituent_2._4_4_ =
               Instruction::GetOperandAs<unsigned_int>
                         ((Instruction *)opcode_name.field_2._8_8_,uStack_2078);
          local_2088 = ValidationState_t::FindDef(_,constituent_2._4_4_);
          if (local_2088 == (Instruction *)0x0) {
LAB_005306a0:
            ValidationState_t::diag
                      (&local_2260,_,SPV_ERROR_INVALID_ID,(Instruction *)opcode_name.field_2._8_8_);
            pDVar8 = DiagnosticStream::operator<<
                               (&local_2260,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_40);
            pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [19])" Constituent <id> ");
            ValidationState_t::getIdName_abi_cxx11_
                      ((string *)&constituent_type,_,constituent_2._4_4_);
            pDVar8 = DiagnosticStream::operator<<
                               (pDVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&constituent_type);
            pDVar8 = DiagnosticStream::operator<<
                               (pDVar8,(char (*) [29])" is not a constant or undef.");
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
            std::__cxx11::string::~string((string *)&constituent_type);
            DiagnosticStream::~DiagnosticStream(&local_2260);
            goto LAB_0053119e;
          }
          OVar2 = Instruction::opcode(local_2088);
          bVar1 = spvOpcodeIsConstantOrUndef(OVar2);
          if (!bVar1) goto LAB_005306a0;
          uVar3 = Instruction::type_id(local_2088);
          local_2288 = ValidationState_t::FindDef(_,uVar3);
          if (local_2288 == (Instruction *)0x0) {
            ValidationState_t::diag(&local_2460,_,SPV_ERROR_INVALID_ID,local_2088);
            pDVar8 = DiagnosticStream::operator<<
                               (&local_2460,(char (*) [28])"Result type is not defined.");
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
            DiagnosticStream::~DiagnosticStream(&local_2460);
            goto LAB_0053119e;
          }
          uVar3 = Instruction::id(local_1a98);
          uVar7 = Instruction::id(local_2288);
          if (uVar3 != uVar7) {
            ValidationState_t::diag
                      (&local_2638,_,SPV_ERROR_INVALID_ID,(Instruction *)opcode_name.field_2._8_8_);
            pDVar8 = DiagnosticStream::operator<<
                               (&local_2638,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_40);
            pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [19])" Constituent <id> ");
            ValidationState_t::getIdName_abi_cxx11_(&local_2658,_,constituent_2._4_4_);
            pDVar8 = DiagnosticStream::operator<<(pDVar8,&local_2658);
            pDVar8 = DiagnosticStream::operator<<
                               (pDVar8,(char (*) [40])"s type does not match Result Type <id> ");
            uVar3 = Instruction::id(local_70);
            ValidationState_t::getIdName_abi_cxx11_((string *)&member_count,_,uVar3);
            pDVar8 = DiagnosticStream::operator<<
                               (pDVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&member_count);
            pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [22])"s array element type.");
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
            std::__cxx11::string::~string((string *)&member_count);
            std::__cxx11::string::~string((string *)&local_2658);
            DiagnosticStream::~DiagnosticStream(&local_2638);
            goto LAB_0053119e;
          }
          uStack_2078 = uStack_2078 + 1;
        }
      }
      else if (OVar2 == OpTypeStruct) {
        pvVar9 = Instruction::words(local_70);
        sVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar9);
        local_2680 = sVar10 - 2;
        if (local_2680 != uStack_278) {
          ValidationState_t::diag
                    (&local_2858,_,SPV_ERROR_INVALID_ID,(Instruction *)opcode_name.field_2._8_8_);
          pDVar8 = DiagnosticStream::operator<<
                             (&local_2858,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40);
          pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [19])" Constituent <id> ");
          uVar3 = Instruction::type_id((Instruction *)opcode_name.field_2._8_8_);
          ValidationState_t::getIdName_abi_cxx11_(&local_2878,_,uVar3);
          pDVar8 = DiagnosticStream::operator<<(pDVar8,&local_2878);
          pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [40])0x6247ab);
          uVar3 = Instruction::id(local_70);
          ValidationState_t::getIdName_abi_cxx11_((string *)&member_index,_,uVar3);
          pDVar8 = DiagnosticStream::operator<<
                             (pDVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&member_index);
          pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [23])"s struct member count.");
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
          std::__cxx11::string::~string((string *)&member_index);
          std::__cxx11::string::~string((string *)&local_2878);
          DiagnosticStream::~DiagnosticStream(&local_2858);
          goto LAB_0053119e;
        }
        constituent_id_3 = 2;
        local_28a0 = 1;
        while( true ) {
          uVar12 = (ulong)constituent_id_3;
          pvVar13 = Instruction::operands((Instruction *)opcode_name.field_2._8_8_);
          sVar10 = std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::size
                             (pvVar13);
          if (sVar10 <= uVar12) break;
          constituent_3._4_4_ =
               Instruction::GetOperandAs<unsigned_int>
                         ((Instruction *)opcode_name.field_2._8_8_,(ulong)constituent_id_3);
          local_28b0 = ValidationState_t::FindDef(_,constituent_3._4_4_);
          if (local_28b0 == (Instruction *)0x0) {
LAB_00530b08:
            ValidationState_t::diag
                      (&local_2a88,_,SPV_ERROR_INVALID_ID,(Instruction *)opcode_name.field_2._8_8_);
            pDVar8 = DiagnosticStream::operator<<
                               (&local_2a88,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_40);
            pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [19])" Constituent <id> ");
            ValidationState_t::getIdName_abi_cxx11_
                      ((string *)&constituent_type_1,_,constituent_3._4_4_);
            pDVar8 = DiagnosticStream::operator<<
                               (pDVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&constituent_type_1);
            pDVar8 = DiagnosticStream::operator<<
                               (pDVar8,(char (*) [29])" is not a constant or undef.");
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
            std::__cxx11::string::~string((string *)&constituent_type_1);
            DiagnosticStream::~DiagnosticStream(&local_2a88);
            goto LAB_0053119e;
          }
          OVar2 = Instruction::opcode(local_28b0);
          bVar1 = spvOpcodeIsConstantOrUndef(OVar2);
          if (!bVar1) goto LAB_00530b08;
          uVar3 = Instruction::type_id(local_28b0);
          local_2ab0 = ValidationState_t::FindDef(_,uVar3);
          if (local_2ab0 == (Instruction *)0x0) {
            ValidationState_t::diag
                      ((DiagnosticStream *)local_2c88,_,SPV_ERROR_INVALID_ID,local_28b0);
            pDVar8 = DiagnosticStream::operator<<
                               ((DiagnosticStream *)local_2c88,
                                (char (*) [28])"Result type is not defined.");
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_2c88);
            goto LAB_0053119e;
          }
          member_type._4_4_ = Instruction::GetOperandAs<unsigned_int>(local_70,(ulong)local_28a0);
          local_2c98 = ValidationState_t::FindDef(_,member_type._4_4_);
          if (local_2c98 == (Instruction *)0x0) {
LAB_00530ca1:
            ValidationState_t::diag
                      (&local_2e70,_,SPV_ERROR_INVALID_ID,(Instruction *)opcode_name.field_2._8_8_);
            pDVar8 = DiagnosticStream::operator<<
                               (&local_2e70,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_40);
            pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [19])" Constituent <id> ");
            ValidationState_t::getIdName_abi_cxx11_(&local_2e90,_,constituent_3._4_4_);
            pDVar8 = DiagnosticStream::operator<<(pDVar8,&local_2e90);
            pDVar8 = DiagnosticStream::operator<<
                               (pDVar8,(char (*) [43])" type does not match the Result Type <id> ");
            uVar3 = Instruction::id(local_70);
            ValidationState_t::getIdName_abi_cxx11_(&local_2eb0,_,uVar3);
            pDVar8 = DiagnosticStream::operator<<(pDVar8,&local_2eb0);
            pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [15])"s member type.");
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
            std::__cxx11::string::~string((string *)&local_2eb0);
            std::__cxx11::string::~string((string *)&local_2e90);
            DiagnosticStream::~DiagnosticStream(&local_2e70);
            goto LAB_0053119e;
          }
          uVar3 = Instruction::id(local_2c98);
          uVar7 = Instruction::id(local_2ab0);
          if (uVar3 != uVar7) goto LAB_00530ca1;
          constituent_id_3 = constituent_id_3 + 1;
          local_28a0 = local_28a0 + 1;
        }
      }
      else if ((OVar2 == OpTypeCooperativeMatrixKHR) || (OVar2 == OpTypeCooperativeMatrixNV)) {
        if (uStack_278 != 1) {
          ValidationState_t::diag
                    (&local_3088,_,SPV_ERROR_INVALID_ID,(Instruction *)opcode_name.field_2._8_8_);
          pDVar8 = DiagnosticStream::operator<<
                             (&local_3088,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40);
          pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [19])" Constituent <id> ");
          uVar3 = Instruction::type_id((Instruction *)opcode_name.field_2._8_8_);
          ValidationState_t::getIdName_abi_cxx11_((string *)local_30a8,_,uVar3);
          pDVar8 = DiagnosticStream::operator<<
                             (pDVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_30a8);
          pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [20])" count must be one.");
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
          std::__cxx11::string::~string((string *)local_30a8);
          DiagnosticStream::~DiagnosticStream(&local_3088);
          goto LAB_0053119e;
        }
        constituent_4._4_4_ =
             Instruction::GetOperandAs<unsigned_int>((Instruction *)opcode_name.field_2._8_8_,2);
        local_30b8 = ValidationState_t::FindDef(_,constituent_4._4_4_);
        if (local_30b8 != (Instruction *)0x0) {
          OVar2 = Instruction::opcode(local_30b8);
          bVar1 = spvOpcodeIsConstantOrUndef(OVar2);
          if (bVar1) {
            uVar3 = Instruction::type_id(local_30b8);
            local_32b8 = ValidationState_t::FindDef(_,uVar3);
            if (local_32b8 == (Instruction *)0x0) {
              ValidationState_t::diag
                        ((DiagnosticStream *)local_3490,_,SPV_ERROR_INVALID_ID,local_30b8);
              pDVar8 = DiagnosticStream::operator<<
                                 ((DiagnosticStream *)local_3490,
                                  (char (*) [28])"Result type is not defined.");
              __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
              DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3490);
              goto LAB_0053119e;
            }
            component_type_2._4_4_ = Instruction::GetOperandAs<unsigned_int>(local_70,1);
            local_34a0 = ValidationState_t::FindDef(_,component_type_2._4_4_);
            if (local_34a0 != (Instruction *)0x0) {
              uVar3 = Instruction::id(local_34a0);
              uVar7 = Instruction::id(local_32b8);
              if (uVar3 == uVar7) goto LAB_0053118d;
            }
            ValidationState_t::diag
                      (&local_3678,_,SPV_ERROR_INVALID_ID,(Instruction *)opcode_name.field_2._8_8_);
            pDVar8 = DiagnosticStream::operator<<
                               (&local_3678,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_40);
            pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [19])" Constituent <id> ");
            ValidationState_t::getIdName_abi_cxx11_(&local_3698,_,constituent_4._4_4_);
            pDVar8 = DiagnosticStream::operator<<(pDVar8,&local_3698);
            pDVar8 = DiagnosticStream::operator<<
                               (pDVar8,(char (*) [43])" type does not match the Result Type <id> ");
            uVar3 = Instruction::id(local_70);
            ValidationState_t::getIdName_abi_cxx11_(&local_36b8,_,uVar3);
            pDVar8 = DiagnosticStream::operator<<(pDVar8,&local_36b8);
            pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [18])"s component type.");
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
            std::__cxx11::string::~string((string *)&local_36b8);
            std::__cxx11::string::~string((string *)&local_3698);
            DiagnosticStream::~DiagnosticStream(&local_3678);
            goto LAB_0053119e;
          }
        }
        ValidationState_t::diag
                  (&local_3290,_,SPV_ERROR_INVALID_ID,(Instruction *)opcode_name.field_2._8_8_);
        pDVar8 = DiagnosticStream::operator<<
                           (&local_3290,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40);
        pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [19])" Constituent <id> ");
        ValidationState_t::getIdName_abi_cxx11_((string *)&constituent_type_2,_,constituent_4._4_4_)
        ;
        pDVar8 = DiagnosticStream::operator<<
                           (pDVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&constituent_type_2);
        pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [29])" is not a constant or undef.");
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
        std::__cxx11::string::~string((string *)&constituent_type_2);
        DiagnosticStream::~DiagnosticStream(&local_3290);
        goto LAB_0053119e;
      }
LAB_0053118d:
      __local._4_4_ = SPV_SUCCESS;
      goto LAB_0053119e;
    }
  }
  ValidationState_t::diag
            (&local_248,_,SPV_ERROR_INVALID_ID,(Instruction *)opcode_name.field_2._8_8_);
  pDVar8 = DiagnosticStream::operator<<
                     (&local_248,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40)
  ;
  pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [19])0x631871);
  uVar3 = Instruction::type_id((Instruction *)opcode_name.field_2._8_8_);
  ValidationState_t::getIdName_abi_cxx11_(&local_268,_,uVar3);
  pDVar8 = DiagnosticStream::operator<<(pDVar8,&local_268);
  pDVar8 = DiagnosticStream::operator<<(pDVar8,(char (*) [26])" is not a composite type.");
  __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
  std::__cxx11::string::~string((string *)&local_268);
  DiagnosticStream::~DiagnosticStream(&local_248);
LAB_0053119e:
  constituent_count._4_4_ = 1;
  std::__cxx11::string::~string((string *)local_40);
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateConstantComposite(ValidationState_t& _,
                                       const Instruction* inst) {
  std::string opcode_name = std::string("Op") + spvOpcodeString(inst->opcode());

  const auto result_type = _.FindDef(inst->type_id());
  if (!result_type || !spvOpcodeIsComposite(result_type->opcode())) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << opcode_name << " Result Type <id> "
           << _.getIdName(inst->type_id()) << " is not a composite type.";
  }

  const auto constituent_count = inst->words().size() - 3;
  switch (result_type->opcode()) {
    case spv::Op::OpTypeVector: {
      const auto component_count = result_type->GetOperandAs<uint32_t>(2);
      if (component_count != constituent_count) {
        // TODO: Output ID's on diagnostic
        return _.diag(SPV_ERROR_INVALID_ID, inst)
               << opcode_name
               << " Constituent <id> count does not match "
                  "Result Type <id> "
               << _.getIdName(result_type->id()) << "s vector component count.";
      }
      const auto component_type =
          _.FindDef(result_type->GetOperandAs<uint32_t>(1));
      if (!component_type) {
        return _.diag(SPV_ERROR_INVALID_ID, result_type)
               << "Component type is not defined.";
      }
      for (size_t constituent_index = 2;
           constituent_index < inst->operands().size(); constituent_index++) {
        const auto constituent_id =
            inst->GetOperandAs<uint32_t>(constituent_index);
        const auto constituent = _.FindDef(constituent_id);
        if (!constituent ||
            !spvOpcodeIsConstantOrUndef(constituent->opcode())) {
          return _.diag(SPV_ERROR_INVALID_ID, inst)
                 << opcode_name << " Constituent <id> "
                 << _.getIdName(constituent_id)
                 << " is not a constant or undef.";
        }
        const auto constituent_result_type = _.FindDef(constituent->type_id());
        if (!constituent_result_type ||
            component_type->id() != constituent_result_type->id()) {
          return _.diag(SPV_ERROR_INVALID_ID, inst)
                 << opcode_name << " Constituent <id> "
                 << _.getIdName(constituent_id)
                 << "s type does not match Result Type <id> "
                 << _.getIdName(result_type->id()) << "s vector element type.";
        }
      }
    } break;
    case spv::Op::OpTypeMatrix: {
      const auto column_count = result_type->GetOperandAs<uint32_t>(2);
      if (column_count != constituent_count) {
        // TODO: Output ID's on diagnostic
        return _.diag(SPV_ERROR_INVALID_ID, inst)
               << opcode_name
               << " Constituent <id> count does not match "
                  "Result Type <id> "
               << _.getIdName(result_type->id()) << "s matrix column count.";
      }

      const auto column_type = _.FindDef(result_type->words()[2]);
      if (!column_type) {
        return _.diag(SPV_ERROR_INVALID_ID, result_type)
               << "Column type is not defined.";
      }
      const auto component_count = column_type->GetOperandAs<uint32_t>(2);
      const auto component_type =
          _.FindDef(column_type->GetOperandAs<uint32_t>(1));
      if (!component_type) {
        return _.diag(SPV_ERROR_INVALID_ID, column_type)
               << "Component type is not defined.";
      }

      for (size_t constituent_index = 2;
           constituent_index < inst->operands().size(); constituent_index++) {
        const auto constituent_id =
            inst->GetOperandAs<uint32_t>(constituent_index);
        const auto constituent = _.FindDef(constituent_id);
        if (!constituent ||
            !spvOpcodeIsConstantOrUndef(constituent->opcode())) {
          // The message says "... or undef" because the spec does not say
          // undef is a constant.
          return _.diag(SPV_ERROR_INVALID_ID, inst)
                 << opcode_name << " Constituent <id> "
                 << _.getIdName(constituent_id)
                 << " is not a constant or undef.";
        }
        const auto vector = _.FindDef(constituent->type_id());
        if (!vector) {
          return _.diag(SPV_ERROR_INVALID_ID, constituent)
                 << "Result type is not defined.";
        }
        if (column_type->opcode() != vector->opcode()) {
          return _.diag(SPV_ERROR_INVALID_ID, inst)
                 << opcode_name << " Constituent <id> "
                 << _.getIdName(constituent_id)
                 << " type does not match Result Type <id> "
                 << _.getIdName(result_type->id()) << "s matrix column type.";
        }
        const auto vector_component_type =
            _.FindDef(vector->GetOperandAs<uint32_t>(1));
        if (component_type->id() != vector_component_type->id()) {
          return _.diag(SPV_ERROR_INVALID_ID, inst)
                 << opcode_name << " Constituent <id> "
                 << _.getIdName(constituent_id)
                 << " component type does not match Result Type <id> "
                 << _.getIdName(result_type->id())
                 << "s matrix column component type.";
        }
        if (component_count != vector->words()[3]) {
          return _.diag(SPV_ERROR_INVALID_ID, inst)
                 << opcode_name << " Constituent <id> "
                 << _.getIdName(constituent_id)
                 << " vector component count does not match Result Type <id> "
                 << _.getIdName(result_type->id())
                 << "s vector component count.";
        }
      }
    } break;
    case spv::Op::OpTypeArray: {
      auto element_type = _.FindDef(result_type->GetOperandAs<uint32_t>(1));
      if (!element_type) {
        return _.diag(SPV_ERROR_INVALID_ID, result_type)
               << "Element type is not defined.";
      }
      const auto length = _.FindDef(result_type->GetOperandAs<uint32_t>(2));
      if (!length) {
        return _.diag(SPV_ERROR_INVALID_ID, result_type)
               << "Length is not defined.";
      }
      bool is_int32;
      bool is_const;
      uint32_t value;
      std::tie(is_int32, is_const, value) = _.EvalInt32IfConst(length->id());
      if (is_int32 && is_const && value != constituent_count) {
        return _.diag(SPV_ERROR_INVALID_ID, inst)
               << opcode_name
               << " Constituent count does not match "
                  "Result Type <id> "
               << _.getIdName(result_type->id()) << "s array length.";
      }
      for (size_t constituent_index = 2;
           constituent_index < inst->operands().size(); constituent_index++) {
        const auto constituent_id =
            inst->GetOperandAs<uint32_t>(constituent_index);
        const auto constituent = _.FindDef(constituent_id);
        if (!constituent ||
            !spvOpcodeIsConstantOrUndef(constituent->opcode())) {
          return _.diag(SPV_ERROR_INVALID_ID, inst)
                 << opcode_name << " Constituent <id> "
                 << _.getIdName(constituent_id)
                 << " is not a constant or undef.";
        }
        const auto constituent_type = _.FindDef(constituent->type_id());
        if (!constituent_type) {
          return _.diag(SPV_ERROR_INVALID_ID, constituent)
                 << "Result type is not defined.";
        }
        if (element_type->id() != constituent_type->id()) {
          return _.diag(SPV_ERROR_INVALID_ID, inst)
                 << opcode_name << " Constituent <id> "
                 << _.getIdName(constituent_id)
                 << "s type does not match Result Type <id> "
                 << _.getIdName(result_type->id()) << "s array element type.";
        }
      }
    } break;
    case spv::Op::OpTypeStruct: {
      const auto member_count = result_type->words().size() - 2;
      if (member_count != constituent_count) {
        return _.diag(SPV_ERROR_INVALID_ID, inst)
               << opcode_name << " Constituent <id> "
               << _.getIdName(inst->type_id())
               << " count does not match Result Type <id> "
               << _.getIdName(result_type->id()) << "s struct member count.";
      }
      for (uint32_t constituent_index = 2, member_index = 1;
           constituent_index < inst->operands().size();
           constituent_index++, member_index++) {
        const auto constituent_id =
            inst->GetOperandAs<uint32_t>(constituent_index);
        const auto constituent = _.FindDef(constituent_id);
        if (!constituent ||
            !spvOpcodeIsConstantOrUndef(constituent->opcode())) {
          return _.diag(SPV_ERROR_INVALID_ID, inst)
                 << opcode_name << " Constituent <id> "
                 << _.getIdName(constituent_id)
                 << " is not a constant or undef.";
        }
        const auto constituent_type = _.FindDef(constituent->type_id());
        if (!constituent_type) {
          return _.diag(SPV_ERROR_INVALID_ID, constituent)
                 << "Result type is not defined.";
        }

        const auto member_type_id =
            result_type->GetOperandAs<uint32_t>(member_index);
        const auto member_type = _.FindDef(member_type_id);
        if (!member_type || member_type->id() != constituent_type->id()) {
          return _.diag(SPV_ERROR_INVALID_ID, inst)
                 << opcode_name << " Constituent <id> "
                 << _.getIdName(constituent_id)
                 << " type does not match the Result Type <id> "
                 << _.getIdName(result_type->id()) << "s member type.";
        }
      }
    } break;
    case spv::Op::OpTypeCooperativeMatrixKHR:
    case spv::Op::OpTypeCooperativeMatrixNV: {
      if (1 != constituent_count) {
        return _.diag(SPV_ERROR_INVALID_ID, inst)
               << opcode_name << " Constituent <id> "
               << _.getIdName(inst->type_id()) << " count must be one.";
      }
      const auto constituent_id = inst->GetOperandAs<uint32_t>(2);
      const auto constituent = _.FindDef(constituent_id);
      if (!constituent || !spvOpcodeIsConstantOrUndef(constituent->opcode())) {
        return _.diag(SPV_ERROR_INVALID_ID, inst)
               << opcode_name << " Constituent <id> "
               << _.getIdName(constituent_id) << " is not a constant or undef.";
      }
      const auto constituent_type = _.FindDef(constituent->type_id());
      if (!constituent_type) {
        return _.diag(SPV_ERROR_INVALID_ID, constituent)
               << "Result type is not defined.";
      }

      const auto component_type_id = result_type->GetOperandAs<uint32_t>(1);
      const auto component_type = _.FindDef(component_type_id);
      if (!component_type || component_type->id() != constituent_type->id()) {
        return _.diag(SPV_ERROR_INVALID_ID, inst)
               << opcode_name << " Constituent <id> "
               << _.getIdName(constituent_id)
               << " type does not match the Result Type <id> "
               << _.getIdName(result_type->id()) << "s component type.";
      }
    } break;
    default:
      break;
  }
  return SPV_SUCCESS;
}